

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

int Compare(Mat *a,Mat *b,float epsilon)

{
  bool bVar1;
  float *pfVar2;
  Mat *pMVar3;
  long in_RSI;
  long in_RDI;
  int j;
  float *pb;
  float *pa;
  int i;
  Mat mb;
  Mat ma;
  int q;
  int in_stack_ffffffffffffff24;
  Mat *in_stack_ffffffffffffff28;
  float *pfVar4;
  uint local_c4;
  uint local_b0;
  Mat local_a0;
  Mat local_60;
  uint local_20;
  long local_10;
  int local_4;
  
  if (*(int *)(in_RDI + 0x28) == *(int *)(in_RSI + 0x28)) {
    if (*(int *)(in_RDI + 0x2c) == *(int *)(in_RSI + 0x2c)) {
      if (*(int *)(in_RDI + 0x30) == *(int *)(in_RSI + 0x30)) {
        if (*(int *)(in_RDI + 0x34) == *(int *)(in_RSI + 0x34)) {
          if (*(long *)(in_RDI + 0x10) == *(long *)(in_RSI + 0x10)) {
            if (*(int *)(in_RDI + 0x18) == *(int *)(in_RSI + 0x18)) {
              local_10 = in_RDI;
              for (local_20 = 0; (int)local_20 < *(int *)(local_10 + 0x34); local_20 = local_20 + 1)
              {
                ncnn::Mat::channel(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
                ncnn::Mat::channel(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
                for (local_b0 = 0; (int)local_b0 < *(int *)(local_10 + 0x30);
                    local_b0 = local_b0 + 1) {
                  pfVar2 = ncnn::Mat::row(&local_60,local_b0);
                  pfVar4 = pfVar2;
                  pMVar3 = (Mat *)ncnn::Mat::row(&local_a0,local_b0);
                  in_stack_ffffffffffffff28 = pMVar3;
                  for (local_c4 = 0; (int)local_c4 < *(int *)(local_10 + 0x2c);
                      local_c4 = local_c4 + 1) {
                    bVar1 = NearlyEqual(SUB84(pfVar4,0),
                                        (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                                        SUB84(in_stack_ffffffffffffff28,0));
                    in_stack_ffffffffffffff24 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff24);
                    if (!bVar1) {
                      fprintf(_stderr,"value not match  at c:%d h:%d w:%d    expect %f but got %f\n"
                              ,(double)pfVar2[(int)local_c4],
                              (double)*(float *)((long)&pMVar3->data + (long)(int)local_c4 * 4),
                              (ulong)local_20,(ulong)local_b0,(ulong)local_c4);
                      local_4 = -1;
                      bVar1 = true;
                      goto LAB_00118108;
                    }
                  }
                }
                bVar1 = false;
LAB_00118108:
                ncnn::Mat::~Mat((Mat *)0x118112);
                ncnn::Mat::~Mat((Mat *)0x11811f);
                if (bVar1) {
                  return local_4;
                }
              }
              local_4 = 0;
            }
            else {
              fprintf(_stderr,"elempack not match    expect %d but got %d\n",
                      (ulong)*(uint *)(in_RDI + 0x18),(ulong)*(uint *)(in_RSI + 0x18));
              local_4 = -1;
            }
          }
          else {
            fprintf(_stderr,"elemsize not match    expect %d but got %d\n",
                    *(ulong *)(in_RDI + 0x10) & 0xffffffff,*(ulong *)(in_RSI + 0x10) & 0xffffffff);
            local_4 = -1;
          }
        }
        else {
          fprintf(_stderr,"c not match    expect %d but got %d\n",(ulong)*(uint *)(in_RDI + 0x34),
                  (ulong)*(uint *)(in_RSI + 0x34));
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"h not match    expect %d but got %d\n",(ulong)*(uint *)(in_RDI + 0x30),
                (ulong)*(uint *)(in_RSI + 0x30));
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"w not match    expect %d but got %d\n",(ulong)*(uint *)(in_RDI + 0x2c),
              (ulong)*(uint *)(in_RSI + 0x2c));
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"dims not match    expect %d but got %d\n",(ulong)*(uint *)(in_RDI + 0x28),
            (ulong)*(uint *)(in_RSI + 0x28));
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int Compare(const ncnn::Mat& a, const ncnn::Mat& b, float epsilon = 0.001)
{
#define CHECK_MEMBER(m) \
    if (a.m != b.m) \
    { \
        fprintf(stderr, #m" not match    expect %d but got %d\n", (int)a.m, (int)b.m); \
        return -1; \
    }

    CHECK_MEMBER(dims)
    CHECK_MEMBER(w)
    CHECK_MEMBER(h)
    CHECK_MEMBER(c)
    CHECK_MEMBER(elemsize)
    CHECK_MEMBER(elempack)

#undef CHECK_MEMBER

    for (int q=0; q<a.c; q++)
    {
        const ncnn::Mat ma = a.channel(q);
        const ncnn::Mat mb = b.channel(q);
        for (int i=0; i<a.h; i++)
        {
            const float* pa = ma.row(i);
            const float* pb = mb.row(i);
            for (int j=0; j<a.w; j++)
            {
                if (!NearlyEqual(pa[j], pb[j], epsilon))
                {
                    fprintf(stderr, "value not match  at c:%d h:%d w:%d    expect %f but got %f\n", q, i, j, pa[j], pb[j]);
                    return -1;
                }
            }
        }
    }

    return 0;
}